

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar xVar2;
  xmlChar *pxVar3;
  byte *pbVar4;
  unsigned_long uVar5;
  startElementSAXFunc p_Var6;
  int iVar7;
  int iVar8;
  xmlChar *str2;
  xmlChar **ppxVar9;
  xmlParserInputPtr pxVar10;
  xmlChar *pxVar11;
  long lVar12;
  xmlChar **ppxVar13;
  xmlChar *attvalue;
  int local_54;
  xmlChar *local_48;
  xmlChar *local_40;
  int local_34;
  
  pxVar10 = ctxt->input;
  pxVar3 = pxVar10->cur;
  if (*pxVar3 == '<') {
    ppxVar13 = ctxt->atts;
    local_54 = ctxt->maxatts;
    pxVar10->col = pxVar10->col + 1;
    pxVar10->cur = pxVar3 + 1;
    if (pxVar3[1] == '\0') {
      xmlParserInputGrow(pxVar10,0xfa);
    }
    local_40 = xmlParseName(ctxt);
    if (local_40 != (xmlChar *)0x0) {
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      iVar7 = 0;
LAB_00160b1c:
      do {
        pxVar10 = ctxt->input;
        pbVar4 = pxVar10->cur;
        bVar1 = *pbVar4;
        if (bVar1 == 0x2f) {
          if (pbVar4[1] == 0x3e) goto LAB_00160e1a;
        }
        else if ((bVar1 == 0x3e) || ((1 < (byte)(bVar1 - 9) && (bVar1 != 0xd && bVar1 < 0x20))))
        goto LAB_00160e1a;
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_00160e1a;
        local_34 = pxVar10->id;
        uVar5 = pxVar10->consumed;
        pxVar3 = pxVar10->base;
        str2 = xmlParseAttribute(ctxt,&local_48);
        pxVar11 = local_48;
        if (local_48 == (xmlChar *)0x0 || str2 == (xmlChar *)0x0) {
          if (local_48 != (xmlChar *)0x0) {
            (*xmlFree)(local_48);
          }
        }
        else {
          if (iVar7 < 1) {
            if (ppxVar13 != (xmlChar **)0x0) goto LAB_00160beb;
            ppxVar9 = (xmlChar **)(*xmlMalloc)(0xb0);
            if (ppxVar9 == (xmlChar **)0x0) {
              xmlErrMemory(ctxt,(char *)0x0);
              (*xmlFree)(pxVar11);
              local_54 = 0x16;
              ppxVar13 = (xmlChar **)0x0;
              goto LAB_00160ce5;
            }
            local_54 = 0x16;
LAB_00160c64:
            ctxt->atts = ppxVar9;
            ctxt->maxatts = local_54;
            ppxVar13 = ppxVar9;
          }
          else {
            lVar12 = 0;
            do {
              iVar8 = xmlStrEqual(ppxVar13[lVar12],str2);
              if (iVar8 != 0) {
                xmlErrAttributeDup(ctxt,(xmlChar *)0x0,str2);
                (*xmlFree)(pxVar11);
                goto LAB_00160ce5;
              }
              lVar12 = lVar12 + 2;
            } while ((int)lVar12 < iVar7);
LAB_00160beb:
            if (local_54 < iVar7 + 4) {
              local_54 = local_54 * 2;
              ppxVar9 = (xmlChar **)(*xmlRealloc)(ppxVar13,(long)local_54 << 3);
              if (ppxVar9 == (xmlChar **)0x0) {
                xmlErrMemory(ctxt,(char *)0x0);
                (*xmlFree)(pxVar11);
                goto LAB_00160ce5;
              }
              goto LAB_00160c64;
            }
          }
          ppxVar13[iVar7] = str2;
          ppxVar13[(long)iVar7 + 1] = local_48;
          ppxVar13[(long)iVar7 + 2] = (xmlChar *)0x0;
          (ppxVar13 + (long)iVar7 + 2)[1] = (xmlChar *)0x0;
          iVar7 = iVar7 + 2;
        }
LAB_00160ce5:
        pxVar10 = ctxt->input;
        if ((ctxt->progressive == 0) && ((long)pxVar10->end - (long)pxVar10->cur < 0xfa)) {
          xmlGROW(ctxt);
          pxVar10 = ctxt->input;
        }
        xVar2 = *pxVar10->cur;
        if (xVar2 == '/') {
          xVar2 = pxVar10->cur[1];
        }
        if (xVar2 == '>') goto LAB_00160e1a;
        iVar8 = xmlSkipBlankChars(ctxt);
        if (iVar8 == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"attributes construct error\n");
        }
        pxVar10 = ctxt->input;
        pxVar11 = pxVar10->cur;
        lVar12 = (long)pxVar11 - (long)pxVar10->base;
        if ((((pbVar4 + (uVar5 - (long)pxVar3) == (byte *)(pxVar10->consumed + lVar12)) &&
             (str2 == (xmlChar *)0x0)) && (local_34 == pxVar10->id)) && (local_48 == (xmlChar *)0x0)
           ) {
          xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,
                         "xmlParseStartTag: problem parsing attributes\n");
LAB_00160e1a:
          pxVar3 = local_40;
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
              (p_Var6 = ctxt->sax->startElement, p_Var6 != (startElementSAXFunc)0x0)) &&
             (ctxt->disableSAX == 0)) {
            if (iVar7 < 1) {
              (*p_Var6)(ctxt->userData,local_40,(xmlChar **)0x0);
              return pxVar3;
            }
            (*p_Var6)(ctxt->userData,local_40,ppxVar13);
          }
          if (iVar7 < 2 || ppxVar13 == (xmlChar **)0x0) {
            return local_40;
          }
          lVar12 = 1;
          do {
            if (ppxVar13[lVar12] != (xmlChar *)0x0) {
              (*xmlFree)(ppxVar13[lVar12]);
            }
            lVar12 = lVar12 + 2;
          } while ((int)lVar12 < iVar7);
          return local_40;
        }
      } while (ctxt->progressive != 0);
      if (500 < lVar12) {
        if (((long)pxVar10->end - (long)pxVar11 < 500) && (xmlSHRINK(ctxt), ctxt->progressive != 0))
        goto LAB_00160b1c;
        pxVar10 = ctxt->input;
        pxVar11 = pxVar10->cur;
      }
      if ((long)pxVar10->end - (long)pxVar11 < 0xfa) {
        xmlGROW(ctxt);
      }
      goto LAB_00160b1c;
    }
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStartTag: invalid element name\n");
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (ctxt->instate != XML_PARSER_EOF)) {
        int id = ctxt->input->id;
	unsigned long cons = CUR_CONSUMED;

	attname = xmlParseAttribute(ctxt, &attvalue);
        if ((attname != NULL) && (attvalue != NULL)) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    xmlFree(attvalue);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (atts == NULL) {
	        maxatts = 22; /* allow for 10 attrs by default */
	        atts = (const xmlChar **)
		       xmlMalloc(maxatts * sizeof(xmlChar *));
		if (atts == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    } else if (nbatts + 4 > maxatts) {
	        const xmlChar **n;

	        maxatts *= 2;
	        n = (const xmlChar **) xmlRealloc((void *) atts,
					     maxatts * sizeof(const xmlChar *));
		if (n == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		atts = n;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }
	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;
	} else {
	    if (attvalue != NULL)
		xmlFree(attvalue);
	}

failed:

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
        if ((cons == CUR_CONSUMED) && (id == ctxt->input->id) &&
            (attname == NULL) && (attvalue == NULL)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			   "xmlParseStartTag: problem parsing attributes\n");
	    break;
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}